

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O2

void cfl_luma_subsampling_420_hbd_ssse3
               (uint16_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  uint16_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint16_t *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  puVar4 = (uint16_t *)((ulong)((height & 0x7fffffeU) << 5) + (long)pred_buf_q3);
  do {
    if (width == 4) {
      uVar2 = *(undefined8 *)input;
      uVar3 = *(undefined8 *)(input + input_stride);
      auVar6._0_2_ = (short)uVar3 + (short)uVar2;
      auVar6._2_2_ = (short)((ulong)uVar3 >> 0x10) + (short)((ulong)uVar2 >> 0x10);
      auVar6._4_2_ = (short)((ulong)uVar3 >> 0x20) + (short)((ulong)uVar2 >> 0x20);
      auVar6._6_2_ = (short)((ulong)uVar3 >> 0x30) + (short)((ulong)uVar2 >> 0x30);
      auVar6._8_8_ = 0;
      auVar7 = phaddw(auVar6,auVar6);
      *(uint *)pred_buf_q3 = CONCAT22(auVar7._2_2_ * 2,auVar7._0_2_ * 2);
    }
    else {
      puVar1 = input + input_stride;
      auVar7._0_2_ = *puVar1 + *input;
      auVar7._2_2_ = puVar1[1] + input[1];
      auVar7._4_2_ = puVar1[2] + input[2];
      auVar7._6_2_ = puVar1[3] + input[3];
      auVar7._8_2_ = puVar1[4] + input[4];
      auVar7._10_2_ = puVar1[5] + input[5];
      auVar7._12_2_ = puVar1[6] + input[6];
      auVar7._14_2_ = puVar1[7] + input[7];
      if (width == 8) {
        auVar7 = phaddw(auVar7,auVar7);
        *(ulong *)pred_buf_q3 =
             CONCAT26(auVar7._6_2_ * 2,
                      CONCAT24(auVar7._4_2_ * 2,CONCAT22(auVar7._2_2_ * 2,auVar7._0_2_ * 2)));
      }
      else {
        puVar1 = input + (long)input_stride + 8;
        auVar8._0_2_ = *puVar1 + input[8];
        auVar8._2_2_ = puVar1[1] + input[9];
        auVar8._4_2_ = puVar1[2] + input[10];
        auVar8._6_2_ = puVar1[3] + input[0xb];
        auVar8._8_2_ = puVar1[4] + input[0xc];
        auVar8._10_2_ = puVar1[5] + input[0xd];
        auVar8._12_2_ = puVar1[6] + input[0xe];
        auVar8._14_2_ = puVar1[7] + input[0xf];
        auVar7 = phaddw(auVar7,auVar8);
        *pred_buf_q3 = auVar7._0_2_ * 2;
        pred_buf_q3[1] = auVar7._2_2_ * 2;
        pred_buf_q3[2] = auVar7._4_2_ * 2;
        pred_buf_q3[3] = auVar7._6_2_ * 2;
        pred_buf_q3[4] = auVar7._8_2_ * 2;
        pred_buf_q3[5] = auVar7._10_2_ * 2;
        pred_buf_q3[6] = auVar7._12_2_ * 2;
        pred_buf_q3[7] = auVar7._14_2_ * 2;
        if (width == 0x20) {
          puVar1 = input + (long)input_stride + 0x10;
          auVar9._0_2_ = *puVar1 + input[0x10];
          auVar9._2_2_ = puVar1[1] + input[0x11];
          auVar9._4_2_ = puVar1[2] + input[0x12];
          auVar9._6_2_ = puVar1[3] + input[0x13];
          auVar9._8_2_ = puVar1[4] + input[0x14];
          auVar9._10_2_ = puVar1[5] + input[0x15];
          auVar9._12_2_ = puVar1[6] + input[0x16];
          auVar9._14_2_ = puVar1[7] + input[0x17];
          puVar1 = input + (long)input_stride + 0x18;
          auVar5._0_2_ = *puVar1 + input[0x18];
          auVar5._2_2_ = puVar1[1] + input[0x19];
          auVar5._4_2_ = puVar1[2] + input[0x1a];
          auVar5._6_2_ = puVar1[3] + input[0x1b];
          auVar5._8_2_ = puVar1[4] + input[0x1c];
          auVar5._10_2_ = puVar1[5] + input[0x1d];
          auVar5._12_2_ = puVar1[6] + input[0x1e];
          auVar5._14_2_ = puVar1[7] + input[0x1f];
          auVar7 = phaddw(auVar9,auVar5);
          pred_buf_q3[8] = auVar7._0_2_ * 2;
          pred_buf_q3[9] = auVar7._2_2_ * 2;
          pred_buf_q3[10] = auVar7._4_2_ * 2;
          pred_buf_q3[0xb] = auVar7._6_2_ * 2;
          pred_buf_q3[0xc] = auVar7._8_2_ * 2;
          pred_buf_q3[0xd] = auVar7._10_2_ * 2;
          pred_buf_q3[0xe] = auVar7._12_2_ * 2;
          pred_buf_q3[0xf] = auVar7._14_2_ * 2;
        }
      }
    }
    pred_buf_q3 = pred_buf_q3 + 0x20;
    input = input + input_stride * 2;
  } while (pred_buf_q3 < puVar4);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_420_hbd_ssse3(const uint16_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const uint16_t *end = pred_buf_q3 + (height >> 1) * CFL_BUF_LINE;
  const int luma_stride = input_stride << 1;
  do {
    if (width == 4) {
      const __m128i top = _mm_loadl_epi64((__m128i *)input);
      const __m128i bot = _mm_loadl_epi64((__m128i *)(input + input_stride));
      __m128i sum = _mm_add_epi16(top, bot);
      sum = _mm_hadd_epi16(sum, sum);
      *((int *)pred_buf_q3) = _mm_cvtsi128_si32(_mm_add_epi16(sum, sum));
    } else {
      const __m128i top = _mm_loadu_si128((__m128i *)input);
      const __m128i bot = _mm_loadu_si128((__m128i *)(input + input_stride));
      __m128i sum = _mm_add_epi16(top, bot);
      if (width == 8) {
        sum = _mm_hadd_epi16(sum, sum);
        _mm_storel_epi64((__m128i *)pred_buf_q3, _mm_add_epi16(sum, sum));
      } else {
        const __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        const __m128i bot_1 =
            _mm_loadu_si128(((__m128i *)(input + input_stride)) + 1);
        sum = _mm_hadd_epi16(sum, _mm_add_epi16(top_1, bot_1));
        _mm_storeu_si128((__m128i *)pred_buf_q3, _mm_add_epi16(sum, sum));
        if (width == 32) {
          const __m128i top_2 = _mm_loadu_si128(((__m128i *)input) + 2);
          const __m128i bot_2 =
              _mm_loadu_si128(((__m128i *)(input + input_stride)) + 2);
          const __m128i top_3 = _mm_loadu_si128(((__m128i *)input) + 3);
          const __m128i bot_3 =
              _mm_loadu_si128(((__m128i *)(input + input_stride)) + 3);
          const __m128i sum_2 = _mm_add_epi16(top_2, bot_2);
          const __m128i sum_3 = _mm_add_epi16(top_3, bot_3);
          __m128i next_sum = _mm_hadd_epi16(sum_2, sum_3);
          _mm_storeu_si128(((__m128i *)pred_buf_q3) + 1,
                           _mm_add_epi16(next_sum, next_sum));
        }
      }
    }
    input += luma_stride;
  } while ((pred_buf_q3 += CFL_BUF_LINE) < end);
}